

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

ClassDecl * __thiscall SQCompilation::SQParser::ClassExp(SQParser *this,Expr *key)

{
  SQInteger SVar1;
  SQInteger SVar2;
  Arena *this_00;
  ClassDecl *decl;
  Expr *pEVar3;
  Chunk *pCVar4;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  SVar1 = (this->_lex)._tokenline;
  SVar2 = (this->_lex)._tokencolumn;
  if (this->_token == 0x28) {
    Lex(this);
    pEVar3 = Expression(this,SQE_RVALUE);
    Expect(this,0x29);
  }
  else if (this->_token == 0x134) {
    Lex(this);
    pEVar3 = Expression(this,SQE_RVALUE);
  }
  else {
    pEVar3 = (Expr *)0x0;
  }
  if ((this->_token == 0x7b) && (((this->_lex)._prevflags & 1) != 0)) {
    reportDiagnostic(this,0x69);
  }
  Expect(this,0x7b);
  this_00 = this->_astArena;
  pCVar4 = Arena::findChunk(this_00,0x48);
  decl = (ClassDecl *)pCVar4->_ptr;
  pCVar4->_ptr = (uint8_t *)(decl + 1);
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._op = TO_CLASS;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineStart = -1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnStart = -1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineEnd = -1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnEnd = -1;
  (decl->super_TableDecl)._members._arena = this_00;
  (decl->super_TableDecl)._members._vals = (TableMember *)0x0;
  (decl->super_TableDecl)._members._size = 0;
  (decl->super_TableDecl)._members._allocated = 0;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a4e38;
  decl->_key = key;
  decl->_base = pEVar3;
  ParseTableOrClass(this,(TableDecl *)decl,0x3b,0x7d);
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineStart = (int)SVar1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnStart =
       (int)SVar2;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  this->_depth = this->_depth - 1;
  return decl;
}

Assistant:

ClassDecl* SQParser::ClassExp(Expr *key)
{
    NestingChecker nc(this);
    SQInteger l = line(), c = column();
    Expr *baseExpr = NULL;
    if(_token == TK_EXTENDS) {
        Lex();
        baseExpr = Expression(SQE_RVALUE);
    }
    else if (_token == _SC('(')) {
      Lex();
      baseExpr = Expression(SQE_RVALUE);
      Expect(_SC(')'));
    }
    checkBraceIndentationStyle();
    Expect(_SC('{'));
    ClassDecl *d = newNode<ClassDecl>(arena(), key, baseExpr);
    ParseTableOrClass(d, _SC(';'),_SC('}'));
    return setCoordinates(d, l, c);
}